

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertpng.c
# Opt level: O1

opj_image_t * pngtoimage(char *read_idf,opj_cparameters_t *params)

{
  undefined4 uVar1;
  int iVar2;
  OPJ_UINT32 OVar3;
  OPJ_UINT32 OVar4;
  convert_32s_CXPX p_Var5;
  convert_XXx32s_C1R p_Var6;
  byte bVar7;
  int iVar8;
  FILE *__stream;
  size_t sVar9;
  __jmp_buf_tag *__env;
  ulong uVar10;
  code *pcVar11;
  opj_image_t *__ptr;
  void *pvVar12;
  ulong uVar13;
  opj_image_t *poVar14;
  opj_image_t *__ptr_00;
  ulong uVar15;
  char *__format;
  long lVar16;
  png_uint_32 height;
  png_structp png;
  png_uint_32 width;
  png_infop info;
  int color_type;
  int bit_depth;
  ulong local_130;
  FILE *local_128;
  double gamma;
  opj_image_t *local_118;
  convert_XXx32s_C1R local_110;
  convert_32s_CXPX local_108;
  int filter_type;
  int compression_type;
  int interlace_type;
  OPJ_BYTE sigbuf [8];
  OPJ_INT32 *planes [4];
  opj_image_cmptparm_t cmptparm [4];
  
  png = (png_structp)0x0;
  info = (png_infop)0x0;
  height = 0;
  __stream = fopen(read_idf,"rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"pngtoimage: can not open %s\n",read_idf);
    return (opj_image_t *)0x0;
  }
  sVar9 = fread(sigbuf,1,8,__stream);
  if ((sVar9 == 8) && (sigbuf == (OPJ_BYTE  [8])0xa1a0a0d474e5089)) {
    __ptr_00 = (opj_image_t *)0x0;
    png = (png_structp)png_create_read_struct("1.6.37",0,0,0);
    __ptr = __ptr_00;
    poVar14 = __ptr_00;
    if (png == (png_structp)0x0) goto LAB_00112ff5;
    info = (png_infop)png_create_info_struct(png);
    if (info != (png_infop)0x0) {
      __env = (__jmp_buf_tag *)png_set_longjmp_fn(png,longjmp,200);
      iVar8 = _setjmp(__env);
      if (iVar8 == 0) {
        png_init_io(png,__stream);
        png_set_sig_bytes(png,8);
        png_read_info(png,info);
        iVar8 = png_get_IHDR(png,info,&width,&height,&bit_depth,&color_type,&interlace_type,
                             &compression_type,&filter_type);
        if (iVar8 != 0) {
          if (color_type == 3) {
            png_set_expand(png);
          }
          iVar8 = png_get_valid(png,info,0x10);
          if (iVar8 != 0) {
            png_set_expand(png);
          }
          iVar8 = png_get_gAMA(png,info,&gamma);
          if (iVar8 == 0) {
            gamma = 1.0;
          }
          png_set_gamma(0x3ff0000000000000,gamma,png);
          png_read_update_info(png,info);
          bVar7 = png_get_color_type(png,info);
          color_type = (int)bVar7;
          if ((bVar7 < 7) && ((0x55U >> (color_type & 0x1fU) & 1) != 0)) {
            uVar1 = *(undefined4 *)(&DAT_00117988 + (ulong)bVar7 * 4);
            uVar10 = (ulong)*(uint *)(&DAT_001179a4 + (ulong)bVar7 * 4);
            p_Var5 = convert_32s_CXPX_LUT[uVar10];
            bVar7 = png_get_bit_depth(png,info);
            bit_depth = (int)bVar7;
            if (bVar7 < 0x11) {
              local_108 = p_Var5;
              if ((0x116U >> (bit_depth & 0x1fU) & 1) == 0) {
                if (bVar7 != 0x10) goto LAB_00113354;
                pcVar11 = convert_16u32s_C1R;
              }
              else {
                pcVar11 = convert_XXu32s_C1R_LUT[(uint)bVar7];
              }
              __ptr = (opj_image_t *)calloc((ulong)(height + 1),8);
              if (__ptr != (opj_image_t *)0x0) {
                local_110 = pcVar11;
                if (height != 0) {
                  uVar13 = 0;
                  do {
                    sVar9 = png_get_rowbytes(png,info);
                    pvVar12 = malloc(sVar9);
                    *(void **)(&__ptr->x0 + uVar13 * 2) = pvVar12;
                    if (pvVar12 == (void *)0x0) {
                      pngtoimage_cold_1();
                      goto LAB_00113345;
                    }
                    uVar13 = uVar13 + 1;
                  } while (uVar13 < height);
                }
                local_130 = uVar10;
                png_read_image(png,__ptr);
                memset(cmptparm,0,0x90);
                iVar8 = params->subsampling_dx;
                iVar2 = params->subsampling_dy;
                lVar16 = 0;
                do {
                  *(int *)((long)&cmptparm[0].prec + lVar16) = bit_depth;
                  *(int *)((long)&cmptparm[0].bpp + lVar16) = bit_depth;
                  *(undefined4 *)((long)&cmptparm[0].sgnd + lVar16) = 0;
                  *(int *)((long)&cmptparm[0].dx + lVar16) = iVar8;
                  *(int *)((long)&cmptparm[0].dy + lVar16) = iVar2;
                  *(png_uint_32 *)((long)&cmptparm[0].w + lVar16) = width;
                  *(png_uint_32 *)((long)&cmptparm[0].h + lVar16) = height;
                  lVar16 = lVar16 + 0x24;
                } while (uVar10 * 0x24 != lVar16);
                poVar14 = (opj_image_t *)opj_image_create(local_130 & 0xffffffff,cmptparm,uVar1);
                if (poVar14 == (opj_image_t *)0x0) {
LAB_00113345:
                  __ptr_00 = (opj_image_t *)0x0;
                  poVar14 = (opj_image_t *)0x0;
                }
                else {
                  OVar3 = params->image_offset_x0;
                  poVar14->x0 = OVar3;
                  OVar4 = params->image_offset_y0;
                  poVar14->y0 = OVar4;
                  poVar14->x1 = (width - 1) * params->subsampling_dx + OVar3 * 2 + 1;
                  poVar14->y1 = (height - 1) * params->subsampling_dy + OVar4 * 2 + 1;
                  __ptr_00 = (opj_image_t *)malloc(width * uVar10 * 4);
                  p_Var5 = local_108;
                  p_Var6 = local_110;
                  if (__ptr_00 == (opj_image_t *)0x0) {
                    __ptr_00 = (opj_image_t *)0x0;
                  }
                  else {
                    poVar14->comps[uVar10 - 1].alpha = ~(ushort)local_130 & 1;
                    lVar16 = 0;
                    uVar13 = uVar10;
                    do {
                      *(OPJ_INT32 **)((long)planes + lVar16) = (&poVar14->comps->data)[lVar16];
                      lVar16 = lVar16 + 8;
                      uVar13 = uVar13 - 1;
                    } while (uVar13 != 0);
                    local_128 = __stream;
                    if (height != 0) {
                      uVar13 = 0;
                      local_118 = poVar14;
                      do {
                        (*p_Var6)(*(OPJ_BYTE **)(&__ptr->x0 + uVar13 * 2),(OPJ_INT32 *)__ptr_00,
                                  width * uVar10);
                        (*p_Var5)((OPJ_INT32 *)__ptr_00,planes,(OPJ_SIZE_T)width);
                        uVar15 = (ulong)width;
                        planes[0] = planes[0] + uVar15;
                        planes[1] = planes[1] + uVar15;
                        planes[2] = planes[2] + uVar15;
                        planes[3] = planes[3] + uVar15;
                        uVar13 = uVar13 + 1;
                        __stream = local_128;
                        poVar14 = local_118;
                      } while (uVar13 < height);
                    }
                  }
                }
                goto LAB_00112ff5;
              }
              pngtoimage_cold_2();
              goto LAB_00112fef;
            }
LAB_00113354:
            __format = "pngtoimage: bit depth %d is not supported\n";
          }
          else {
            __format = "pngtoimage: colortype %d is not supported\n";
          }
          fprintf(_stderr,__format);
        }
      }
    }
  }
  else {
    fprintf(_stderr,"pngtoimage: %s is no valid PNG file\n",read_idf);
  }
LAB_00112fef:
  __ptr_00 = (opj_image_t *)0x0;
  __ptr = __ptr_00;
  poVar14 = __ptr_00;
LAB_00112ff5:
  if (__ptr != (opj_image_t *)0x0) {
    if (height != 0) {
      uVar10 = 0;
      do {
        if (*(void **)(&__ptr->x0 + uVar10 * 2) != (void *)0x0) {
          free(*(void **)(&__ptr->x0 + uVar10 * 2));
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 < height);
    }
    free(__ptr);
  }
  if (__ptr_00 != (opj_image_t *)0x0) {
    free(__ptr_00);
  }
  if (png != (png_structp)0x0) {
    png_destroy_read_struct(&png,&info,0);
  }
  fclose(__stream);
  return poVar14;
}

Assistant:

opj_image_t *pngtoimage(const char *read_idf, opj_cparameters_t * params)
{
	png_structp  png = NULL;
	png_infop    info = NULL;
	double gamma;
	int bit_depth, interlace_type,compression_type, filter_type;
	OPJ_UINT32 i;
	png_uint_32  width, height = 0U;
	int color_type;
	FILE *reader = NULL;
	OPJ_BYTE** rows = NULL;
	OPJ_INT32* row32s = NULL;
	/* j2k: */
	opj_image_t *image = NULL;
	opj_image_cmptparm_t cmptparm[4];
	OPJ_UINT32 nr_comp;
	OPJ_BYTE sigbuf[8];
	convert_XXx32s_C1R cvtXXTo32s = NULL;
	convert_32s_CXPX cvtCxToPx = NULL;
	OPJ_INT32* planes[4];
	
	if((reader = fopen(read_idf, "rb")) == NULL)
	{
		fprintf(stderr,"pngtoimage: can not open %s\n",read_idf);
		return NULL;
	}
	
	if(fread(sigbuf, 1, MAGIC_SIZE, reader) != MAGIC_SIZE
		 || memcmp(sigbuf, PNG_MAGIC, MAGIC_SIZE) != 0)
	{
		fprintf(stderr,"pngtoimage: %s is no valid PNG file\n",read_idf);
		goto fin;
	}
	
	if((png = png_create_read_struct(PNG_LIBPNG_VER_STRING,
																	 NULL, NULL, NULL)) == NULL)
		goto fin;
	if((info = png_create_info_struct(png)) == NULL)
		goto fin;
	
	if(setjmp(png_jmpbuf(png)))
		goto fin;
	
	png_init_io(png, reader);
	png_set_sig_bytes(png, MAGIC_SIZE);
	
	png_read_info(png, info);
	
	if(png_get_IHDR(png, info, &width, &height,
									&bit_depth, &color_type, &interlace_type,
									&compression_type, &filter_type) == 0)
		goto fin;
	
	/* png_set_expand():
	 * expand paletted images to RGB, expand grayscale images of
	 * less than 8-bit depth to 8-bit depth, and expand tRNS chunks
	 * to alpha channels.
	 */
	if(color_type == PNG_COLOR_TYPE_PALETTE) {
		png_set_expand(png);
	}
	
	if(png_get_valid(png, info, PNG_INFO_tRNS)) {
		png_set_expand(png);
	}
	/* We might wan't to expand background */
	/*
	if(png_get_valid(png, info, PNG_INFO_bKGD)) {
		png_color_16p bgnd;
		png_get_bKGD(png, info, &bgnd);
		png_set_background(png, bgnd, PNG_BACKGROUND_GAMMA_FILE, 1, 1.0);
	}
	*/
	
	if( !png_get_gAMA(png, info, &gamma))
		gamma = 1.0;
	
	/* we're not displaying but converting, screen gamma == 1.0 */
	png_set_gamma(png, 1.0, gamma);
	
	png_read_update_info(png, info);
	
	color_type = png_get_color_type(png, info);
	
	switch (color_type) {
		case PNG_COLOR_TYPE_GRAY:
			nr_comp = 1;
			break;
		case PNG_COLOR_TYPE_GRAY_ALPHA:
			nr_comp = 2;
			break;
		case PNG_COLOR_TYPE_RGB:
			nr_comp = 3;
			break;
		case PNG_COLOR_TYPE_RGB_ALPHA:
			nr_comp = 4;
			break;
		default:
			fprintf(stderr,"pngtoimage: colortype %d is not supported\n", color_type);
			goto fin;
	}
	cvtCxToPx = convert_32s_CXPX_LUT[nr_comp];
	bit_depth = png_get_bit_depth(png, info);
	
	switch (bit_depth) {
		case 1:
		case 2:
		case 4:
		case 8:
			cvtXXTo32s = convert_XXu32s_C1R_LUT[bit_depth];
			break;
		case 16: /* 16 bpp is specific to PNG */
			cvtXXTo32s = convert_16u32s_C1R;
			break;
		default:
			fprintf(stderr,"pngtoimage: bit depth %d is not supported\n", bit_depth);
			goto fin;
	}

	
	rows = (OPJ_BYTE**)calloc(height+1, sizeof(OPJ_BYTE*));
	if(rows == NULL){
		fprintf(stderr, "pngtoimage: memory out\n");
		goto fin;
	}
	for(i = 0; i < height; ++i){
		rows[i] = (OPJ_BYTE*)malloc(png_get_rowbytes(png,info));
		if(rows[i] == NULL){
			fprintf(stderr,"pngtoimage: memory out\n");
			goto fin;
		}
	}	
	png_read_image(png, rows);
	
	/* Create image */
	memset(cmptparm, 0, sizeof(cmptparm));
	for(i = 0; i < nr_comp; ++i)
	{
		cmptparm[i].prec = (OPJ_UINT32)bit_depth;
		/* bits_per_pixel: 8 or 16 */
		cmptparm[i].bpp = (OPJ_UINT32)bit_depth;
		cmptparm[i].sgnd = 0;
		cmptparm[i].dx = (OPJ_UINT32)params->subsampling_dx;
		cmptparm[i].dy = (OPJ_UINT32)params->subsampling_dy;
		cmptparm[i].w = (OPJ_UINT32)width;
		cmptparm[i].h = (OPJ_UINT32)height;
	}
	
	image = opj_image_create(nr_comp, &cmptparm[0], (nr_comp > 2U) ? OPJ_CLRSPC_SRGB : OPJ_CLRSPC_GRAY);
	if(image == NULL) goto fin;
	image->x0 = (OPJ_UINT32)params->image_offset_x0;
	image->y0 = (OPJ_UINT32)params->image_offset_y0;
	image->x1 = (OPJ_UINT32)(image->x0 + (width  - 1) * (OPJ_UINT32)params->subsampling_dx + 1 + image->x0);
	image->y1 = (OPJ_UINT32)(image->y0 + (height - 1) * (OPJ_UINT32)params->subsampling_dy + 1 + image->y0);
	
	row32s = (OPJ_INT32 *)malloc((size_t)width * nr_comp * sizeof(OPJ_INT32));
	if(row32s == NULL) goto fin;
	
	/* Set alpha channel */
	image->comps[nr_comp-1U].alpha = 1U - (nr_comp & 1U);
	
	for(i = 0; i < nr_comp; i++)
	{
		planes[i] = image->comps[i].data;
	}
	
	for(i = 0; i < height; ++i)
	{
		cvtXXTo32s(rows[i], row32s, (OPJ_SIZE_T)width * nr_comp);
		cvtCxToPx(row32s, planes, width);
		planes[0] += width;
		planes[1] += width;
		planes[2] += width;
		planes[3] += width;
	}
fin:
	if(rows)
	{
		for(i = 0; i < height; ++i)
			if(rows[i]) free(rows[i]);
		free(rows);
	}
	if (row32s) {
		free(row32s);
	}
	if(png)
		png_destroy_read_struct(&png, &info, NULL);
	
	fclose(reader);
	
	return image;
	
}